

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON * get_array_item(cJSON *array,size_t index)

{
  cJSON *pcVar1;
  bool bVar2;
  
  if (array == (cJSON *)0x0) {
    return (cJSON *)0x0;
  }
  pcVar1 = (cJSON *)&array->child;
  do {
    pcVar1 = pcVar1->next;
    bVar2 = index != 0;
    index = index - 1;
    if (pcVar1 == (cJSON *)0x0) {
      return pcVar1;
    }
  } while (bVar2);
  return pcVar1;
}

Assistant:

static cJSON* get_array_item(const cJSON *array, size_t index)
{
    cJSON *current_child = NULL;

    if (array == NULL)
    {
        return NULL;
    }

    current_child = array->child;
    while ((current_child != NULL) && (index > 0))
    {
        index--;
        current_child = current_child->next;
    }

    return current_child;
}